

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::BorderAmounts::MergePartialFromCodedStream
          (BorderAmounts *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  Type *this_00;
  pair<int,_int> pVar6;
  int iVar7;
  int iVar8;
  int byte_limit;
  ulong uVar9;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001366e5;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001366e5:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    iVar8 = 6;
    iVar7 = iVar8;
    if (((uVar9 & 0x100000000) == 0) || ((char)uVar9 != 'R' || (uVar5 & 0xfffffff8) != 0x50)) {
      iVar7 = 7;
      if ((uVar5 & 7) != 4 && uVar5 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
        goto LAB_00136762;
      }
    }
    else {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                          (&(this->borderamounts_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < (char)*puVar3)) {
        input->buffer_ = puVar3 + 1;
        bVar4 = true;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar4 = -1 < byte_limit;
      }
      if (((bVar4) &&
          (pVar6 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,byte_limit), -1 < (long)pVar6)) &&
         (bVar4 = BorderAmounts_EdgeSizes::MergePartialFromCodedStream(this_00,input), bVar4)) {
        bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                          (input,pVar6.first);
LAB_00136762:
        iVar7 = iVar8;
        if (bVar4 != false) {
          iVar7 = 0;
        }
      }
    }
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool BorderAmounts::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BorderAmounts)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.BorderAmounts.EdgeSizes borderAmounts = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_borderamounts()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BorderAmounts)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BorderAmounts)
  return false;
#undef DO_
}